

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::Promise<void>_> __thiscall
kj::anon_unknown_36::WebSocketImpl::tryPumpFrom(WebSocketImpl *this,WebSocket *other)

{
  bool bVar1;
  bool bVar2;
  WebSocketImpl *other_00;
  CompressionParameters *pCVar3;
  CompressionParameters *pCVar4;
  WebSocket *in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX_03;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX_04;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar5;
  Maybe<kj::Promise<void>_> MVar6;
  undefined1 local_90 [16];
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Fault local_70;
  Fault f;
  DebugExpression<bool> _kjCondition;
  CompressionParameters *otherConfig;
  CompressionParameters *_otherConfig2961;
  CompressionParameters *config;
  CompressionParameters *_config2960;
  WebSocketImpl *optOther;
  undefined1 local_28 [8];
  WebSocketImpl *_optOther2949;
  WebSocket *other_local;
  WebSocketImpl *this_local;
  
  other_local = other;
  this_local = this;
  dynamicDowncastIfAvailable<kj::(anonymous_namespace)::WebSocketImpl,kj::WebSocket>
            ((kj *)&optOther,in_RDX);
  other_00 = kj::_::readMaybe<kj::(anonymous_namespace)::WebSocketImpl>
                       ((Maybe<kj::(anonymous_namespace)::WebSocketImpl_&> *)&optOther);
  local_28 = (undefined1  [8])other_00;
  if (other_00 == (WebSocketImpl *)0x0) {
    Maybe<kj::Promise<void>_>::Maybe((Maybe<kj::Promise<void>_> *)this);
    aVar5 = extraout_RDX_04;
  }
  else {
    bVar1 = Maybe<kj::EntropySource_&>::operator==((Maybe<kj::EntropySource_&> *)(other + 4));
    bVar2 = Maybe<kj::EntropySource_&>::operator==(&other_00->maskKeyGenerator);
    if (bVar1 == bVar2) {
      Maybe<kj::Promise<void>_>::Maybe((Maybe<kj::Promise<void>_> *)this);
      aVar5 = extraout_RDX;
    }
    else {
      pCVar3 = kj::_::readMaybe<kj::CompressionParameters>
                         ((Maybe<kj::CompressionParameters> *)(other + 5));
      if (pCVar3 == (CompressionParameters *)0x0) {
        bVar1 = Maybe<kj::CompressionParameters>::operator==(&other_00->compressionConfig);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          Maybe<kj::Promise<void>_>::Maybe((Maybe<kj::Promise<void>_> *)this);
          aVar5 = extraout_RDX_02;
          goto LAB_006442ad;
        }
      }
      else {
        pCVar4 = kj::_::readMaybe<kj::CompressionParameters>(&other_00->compressionConfig);
        if (pCVar4 == (CompressionParameters *)0x0) {
          Maybe<kj::Promise<void>_>::Maybe((Maybe<kj::Promise<void>_> *)this);
          aVar5 = extraout_RDX_01;
          goto LAB_006442ad;
        }
        bVar1 = Maybe<unsigned_long>::operator==
                          (&pCVar3->outboundMaxWindowBits,&pCVar4->inboundMaxWindowBits);
        if ((((((bVar1 ^ 0xffU) & 1) != 0) ||
             (bVar1 = Maybe<unsigned_long>::operator==
                                (&pCVar3->inboundMaxWindowBits,&pCVar4->outboundMaxWindowBits),
             ((bVar1 ^ 0xffU) & 1) != 0)) ||
            ((pCVar3->inboundNoContextTakeover & 1U) != (pCVar4->outboundNoContextTakeover & 1U)))
           || ((pCVar3->outboundNoContextTakeover & 1U) != (pCVar4->inboundNoContextTakeover & 1U)))
        {
          Maybe<kj::Promise<void>_>::Maybe((Maybe<kj::Promise<void>_> *)this);
          aVar5 = extraout_RDX_00;
          goto LAB_006442ad;
        }
      }
      f.exception._2_1_ = (*(byte *)((long)&other[0x2c]._vptr_WebSocket + 1) ^ 0xff) & 1;
      f.exception._3_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 2))
      ;
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                        ((DebugExpression *)((long)&f.exception + 3));
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
                  (&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xba6,FAILED,"!disconnected",
                   "_kjCondition,\"WebSocket can\'t send after disconnect()\"",
                   (DebugExpression<bool> *)((long)&f.exception + 3),
                   (char (*) [40])"WebSocket can\'t send after disconnect()");
        kj::_::Debug::Fault::fatal(&local_70);
      }
      f_1.exception._2_1_ = (*(byte *)((long)&other[0x2c]._vptr_WebSocket + 2) ^ 0xff) & 1;
      f_1.exception._3_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (bool *)((long)&f_1.exception + 2));
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                        ((DebugExpression *)((long)&f_1.exception + 3));
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[44]>
                  ((Fault *)(local_90 + 8),
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xba7,FAILED,"!currentlySending",
                   "_kjCondition,\"another message send is already in progress\"",
                   (DebugExpression<bool> *)((long)&f_1.exception + 3),
                   (char (*) [44])"another message send is already in progress");
        kj::_::Debug::Fault::fatal((Fault *)(local_90 + 8));
      }
      *(undefined1 *)((long)&other[0x2c]._vptr_WebSocket + 2) = 1;
      *(undefined1 *)&other[0x2c]._vptr_WebSocket = 1;
      optimizedPumpTo((WebSocketImpl *)local_90,other_00);
      Maybe<kj::Promise<void>_>::Maybe((Maybe<kj::Promise<void>_> *)this,(Promise<void> *)local_90);
      Promise<void>::~Promise((Promise<void> *)local_90);
      aVar5 = extraout_RDX_03;
    }
  }
LAB_006442ad:
  MVar6.ptr.field_1 = aVar5;
  MVar6.ptr._0_8_ = this;
  return (Maybe<kj::Promise<void>_>)MVar6.ptr;
}

Assistant:

kj::Maybe<kj::Promise<void>> tryPumpFrom(WebSocket& other) override {
    KJ_IF_SOME(optOther, kj::dynamicDowncastIfAvailable<WebSocketImpl>(other)) {
      // Both WebSockets are raw WebSockets, so we can pump the streams directly rather than read
      // whole messages.

      if ((maskKeyGenerator == kj::none) == (optOther.maskKeyGenerator == kj::none)) {
        // Oops, it appears that we either believe we are the client side of both sockets, or we
        // are the server side of both sockets. Since clients must "mask" their outgoing frames but
        // servers must *not* do so, we can't direct-pump. Sad.
        return kj::none;
      }

      KJ_IF_SOME(config, compressionConfig) {
        KJ_IF_SOME(otherConfig, optOther.compressionConfig) {
          if (config.outboundMaxWindowBits != otherConfig.inboundMaxWindowBits ||
              config.inboundMaxWindowBits != otherConfig.outboundMaxWindowBits ||
              config.inboundNoContextTakeover!= otherConfig.outboundNoContextTakeover ||
              config.outboundNoContextTakeover!= otherConfig.inboundNoContextTakeover) {
            // Compression configurations differ.
            return kj::none;
          }
        } else {
          // Only one websocket uses compression.
          return kj::none;
        }
      } else {
        if (optOther.compressionConfig != kj::none) {
          // Only one websocket uses compression.
          return kj::none;
        }
      }
      // Both websockets use compatible compression configurations so we can pump directly.

      // Check same error conditions as with sendImpl().
      KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");
      KJ_REQUIRE(!currentlySending, "another message send is already in progress");
      currentlySending = true;

      // If the application chooses to pump messages out, but receives incoming messages normally
      // with `receive()`, then we will receive pings and attempt to send pongs. But we can't
      // safely insert a pong in the middle of a pumped stream. We kind of don't have a choice
      // except to drop them on the floor, which is what will happen if we set `hasSentClose` true.
      // Hopefully most apps that set up a pump do so in both directions at once, and so pings will
      // flow through and pongs will flow back.
      hasSentClose = true;

      return optOther.optimizedPumpTo(*this);
    }